

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfZip.cpp
# Opt level: O0

void Imf_2_5::reconstruct_scalar(char *buf,size_t outSize)

{
  int d;
  uchar *stop;
  uchar *t;
  size_t outSize_local;
  char *buf_local;
  
  for (t = (uchar *)(buf + 1); t < buf + outSize; t = t + 1) {
    *t = t[-1] + *t + 0x80;
  }
  return;
}

Assistant:

static void
reconstruct_scalar(char *buf, size_t outSize)
{
    unsigned char *t    = (unsigned char *) buf + 1;
    unsigned char *stop = (unsigned char *) buf + outSize;

    while (t < stop)
    {
        int d = int (t[-1]) + int (t[0]) - 128;
        t[0] = d;
        ++t;
    }
}